

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeSync.cpp
# Opt level: O0

uint __thiscall
TimeSynchronizer::OnAuthenticatedDatagramTimestamp
          (TimeSynchronizer *this,Counter24 *remoteSendTS24,uint64_t localRecvUsec)

{
  bool bVar1;
  ulong in_RDX;
  TimeSynchronizer *in_RSI;
  Counter24 relativeTS24;
  Counter24 minDeltaTS24;
  uint networkTripUsec;
  Counter24 deltaTS24;
  Counter24 localTS24;
  uint d;
  Counter<unsigned_int,_24U> local_8c;
  Counter<unsigned_int,_24U> local_88;
  Counter<unsigned_int,_24U> local_84;
  ThisType in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint32_t uVar2;
  Counter<unsigned_int,_24U> local_78;
  Counter<unsigned_int,_24U> local_74;
  Counter<unsigned_int,_24U> local_70;
  Counter<unsigned_int,_24U> local_6c [7];
  uint64_t in_stack_ffffffffffffffb0;
  uint64_t in_stack_ffffffffffffffb8;
  Counter24 *in_stack_ffffffffffffffc0;
  WindowedMinTS24 *this_00;
  
  Counter<unsigned_int,_24U>::Counter(local_6c,(uint)(in_RDX >> 3));
  Counter<unsigned_int,_24U>::Counter(&local_74,(ThisType *)in_RSI);
  this_00 = (WindowedMinTS24 *)&local_74;
  Counter<unsigned_int,_24U>::Counter(&local_70,local_6c[0].Value - local_74.Value);
  Counter<unsigned_int,_24U>::Counter(&local_78,&local_70);
  WindowedMinTS24::Update
            (this_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  Recalculate((TimeSynchronizer *)
              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80.Value));
  uVar2 = 0;
  bVar1 = IsSynchronized((TimeSynchronizer *)0x22bc4f);
  if (bVar1) {
    uVar2 = GetMinimumOneWayDelayUsec((TimeSynchronizer *)0x22bc62);
    GetMinDeltaTS24(in_RSI);
    Counter<unsigned_int,_24U>::Counter(&local_84,(ThisType *)&stack0xffffffffffffff80);
    if (0x7fffff < (local_84.Value - local_70.Value & 0xffffff)) {
      Counter<unsigned_int,_24U>::Counter(&local_8c,(ThisType *)&stack0xffffffffffffff80);
      Counter<unsigned_int,_24U>::Counter(&local_88,local_70.Value - local_8c.Value);
      uVar2 = local_88.Value * 8 + uVar2;
    }
  }
  return uVar2;
}

Assistant:

unsigned TimeSynchronizer::OnAuthenticatedDatagramTimestamp(
    Counter24 remoteSendTS24,
    uint64_t localRecvUsec)
{
    const Counter24 localTS24 = (uint32_t)(localRecvUsec >> kTime23LostBits);

    // OWD_i + ClockDelta(L-R)_i = Local Receive Time - Remote Send Time
    const Counter24 deltaTS24 = localTS24 - remoteSendTS24;

    WindowedMinTS24Deltas.Update(deltaTS24, localRecvUsec, kDriftWindowUsec);

    Recalculate();

    // Estimated one-way-delay (OWD) for this datagram in microseconds.
    // This does not include processing time only network delay and perhaps
    // some delays from the Operating System when it is heavily loaded.
    // Set to 0 if trip time is not available
    unsigned networkTripUsec = 0;

    if (IsSynchronized())
    {
        // This is equivalent to the shortest RTT/2 seen so far by any pair of packets,
        // meaning that it is the average of the upstream and downstream OWD.
        networkTripUsec = GetMinimumOneWayDelayUsec();

        // While the OWD is an estimate, the relative delay between that
        // smallest packet pair and the current datagram is actually precise:
        const Counter24 minDeltaTS24 = GetMinDeltaTS24();
        if (deltaTS24 > minDeltaTS24)
        {
            const Counter24 relativeTS24 = deltaTS24 - minDeltaTS24;
            networkTripUsec += relativeTS24.ToUnsigned() << kTime23LostBits;
        }

        // What should happen here is if the delay of each packet varies a lot, then we should
        // get pretty accurate OWD for each packet.  But if the variance is low and the delays
        // for upstream and downstream are asymmetric, then it will underestimate the OWD by
        // half of that asymmetry.  Hopefully this inaccuracy won't cause problems..
    }

    return networkTripUsec;
}